

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O0

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,void *data,PT size)

{
  unsigned_long *puVar1;
  Buffer *pBVar2;
  unsigned_long local_38 [2];
  PT local_28;
  PT room;
  PT size_local;
  void *data_local;
  CbQueue *this_local;
  
  if (size != 0) {
    room = size;
    size_local = (PT)data;
    data_local = this;
    if (this->beg == (Buffer *)0x0) {
      local_38[0] = 0x7e4;
      puVar1 = std::max<unsigned_long>(local_38,&room);
      pBVar2 = Buffer::New(*puVar1,(Buffer *)0x0);
      this->beg = pBVar2;
      this->end = this->beg;
      this->off = 0;
    }
    else {
      local_28 = Buffer::room(this->end);
      if (room <= local_28) {
        memcpy(this->end->data + this->end->used,(void *)size_local,room);
        this->end->used = room + this->end->used;
        return;
      }
      memcpy(this->end->data + this->end->used,(void *)size_local,local_28);
      size_local = size_local + local_28;
      this->end->used = this->end->size;
      room = room - local_28;
      local_38[1] = 0x7e4;
      puVar1 = std::max<unsigned_long>(local_38 + 1,&room);
      pBVar2 = Buffer::New(*puVar1,this->end);
      this->end = pBVar2;
    }
    while (this->end->size < room) {
      memcpy(this->end->data,(void *)size_local,this->end->size);
      size_local = size_local + this->end->size;
      this->end->used = this->end->size;
      room = room - this->end->size;
      pBVar2 = Buffer::New(0x7e4,this->end);
      this->end = pBVar2;
    }
    memcpy(this->end->data,(void *)size_local,room);
    this->end->used = room;
  }
  return;
}

Assistant:

void CbQueue::write_some( const void *data, PT size ) {
    if ( not size )
        return;

    if ( beg ) {
        PT room = end->room();
        if ( size <= room ) {
            memcpy( end->data + end->used, data, size );
            end->used += size;
            return;
        }
        // -> size > room, buffer with used that may be != 0
        memcpy( end->data + end->used, data, room ); data = reinterpret_cast<const PI8 *>( data ) + room;
        end->used = end->size;
        size -= room;

        end = Buffer::New( std::max( PT( Buffer::default_size ), size ), end );
    } else {
        beg = Buffer::New( std::max( PT( Buffer::default_size ), size ) );
        end = beg;
        off = 0;
    }

    // -> size != 0, buffers with used == 0
    while ( size > end->size ) {
        memcpy( end->data, data, end->size ); data = reinterpret_cast<const PI8 *>( data ) + end->size;
        end->used = end->size;
        size -= end->size;

        end = Buffer::New( Buffer::default_size, end );
    }

    // -> buffer with used == 0, size < Buffer::size
    memcpy( end->data, data, size );
    end->used = size;
}